

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall RealCommandRunner::StartCommand(RealCommandRunner *this,Edge *edge)

{
  bool use_console;
  Subprocess *pSVar1;
  string command;
  string sStack_48;
  pair<Subprocess_*,_Edge_*> local_28;
  
  Edge::EvaluateCommand_abi_cxx11_(&sStack_48,edge,false);
  use_console = Edge::use_console(edge);
  pSVar1 = SubprocessSet::Add(&this->subprocs_,&sStack_48,use_console);
  if (pSVar1 != (Subprocess *)0x0) {
    local_28.first = pSVar1;
    local_28.second = edge;
    std::
    _Rb_tree<Subprocess_const*,std::pair<Subprocess_const*const,Edge*>,std::_Select1st<std::pair<Subprocess_const*const,Edge*>>,std::less<Subprocess_const*>,std::allocator<std::pair<Subprocess_const*const,Edge*>>>
    ::_M_emplace_unique<std::pair<Subprocess*,Edge*>>
              ((_Rb_tree<Subprocess_const*,std::pair<Subprocess_const*const,Edge*>,std::_Select1st<std::pair<Subprocess_const*const,Edge*>>,std::less<Subprocess_const*>,std::allocator<std::pair<Subprocess_const*const,Edge*>>>
                *)&this->subproc_to_edge_,&local_28);
  }
  std::__cxx11::string::~string((string *)&sStack_48);
  return pSVar1 != (Subprocess *)0x0;
}

Assistant:

bool RealCommandRunner::StartCommand(Edge* edge) {
  string command = edge->EvaluateCommand();
  Subprocess* subproc = subprocs_.Add(command, edge->use_console());
  if (!subproc)
    return false;
  subproc_to_edge_.insert(make_pair(subproc, edge));

  return true;
}